

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

BVSparse<Memory::JitArenaAllocator> * __thiscall
BackwardPass::GetByteCodeRegisterUpwardExposed
          (BackwardPass *this,BasicBlock *block,Func *func,JitArenaAllocator *alloc)

{
  Type TVar1;
  long lVar2;
  RegSlot i;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  BVSparse<Memory::JitArenaAllocator> *pBVar3;
  StackSym *this_01;
  Func *pFVar4;
  StackSym *stackSym;
  ulong uVar5;
  ulong uVar6;
  
  this_00 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,alloc,0x3f1274);
  this_00->head = (Type_conflict)0x0;
  this_00->lastFoundIndex = (Type_conflict)0x0;
  this_00->alloc = alloc;
  this_00->lastUsedNodePrevNextField = (Type)this_00;
  pBVar3 = block->byteCodeUpwardExposedUsed;
  while (pBVar3 = (BVSparse<Memory::JitArenaAllocator> *)pBVar3->head,
        pBVar3 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    uVar5 = ((Type *)&pBVar3->alloc)->word;
    if (uVar5 != 0) {
      TVar1 = *(Type *)&pBVar3->lastFoundIndex;
      uVar6 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      do {
        BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar6);
        this_01 = (StackSym *)SymTable::Find(func->m_symTable,(BVIndex)uVar6 + TVar1);
        if ((((this_01 != (StackSym *)0x0) && ((this_01->super_Sym).m_kind == SymKindStack)) &&
            (pFVar4 = StackSym::GetByteCodeFunc(this_01), pFVar4 == func)) &&
           ((this_01->field_0x19 & 0x20) != 0)) {
          i = StackSym::GetByteCodeRegSlot(this_01);
          BVSparse<Memory::JitArenaAllocator>::Set(this_00,i);
        }
        uVar5 = uVar5 & ~(1L << (uVar6 & 0x3f));
        lVar2 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar6 = (ulong)(-(uint)(uVar5 == 0) | (uint)lVar2);
      } while (uVar5 != 0);
    }
  }
  return this_00;
}

Assistant:

BVSparse<JitArenaAllocator>*
BackwardPass::GetByteCodeRegisterUpwardExposed(BasicBlock* block, Func* func, JitArenaAllocator* alloc)
{
    BVSparse<JitArenaAllocator>* byteCodeRegisterUpwardExposed = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    // Convert the sym to the corresponding bytecode register
    FOREACH_BITSET_IN_SPARSEBV(symID, block->byteCodeUpwardExposedUsed)
    {
        Sym* sym = func->m_symTable->Find(symID);
        if (sym && sym->IsStackSym())
        {
            StackSym* stackSym = sym->AsStackSym();
            // Make sure we only look at bytecode from the func we're interested in
            if (stackSym->GetByteCodeFunc() == func && stackSym->HasByteCodeRegSlot())
            {
                Js::RegSlot bytecode = stackSym->GetByteCodeRegSlot();
                byteCodeRegisterUpwardExposed->Set(bytecode);
            }
        }
    }
    NEXT_BITSET_IN_SPARSEBV;

    return byteCodeRegisterUpwardExposed;
}